

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::HugeintToDecimalCast<int>
          (duckdb *this,hugeint_t input,int *result,CastParameters *parameters,uint8_t width,
          uint8_t scale)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int32_t *result_00;
  uchar params_2;
  undefined3 in_register_00000089;
  uint uVar3;
  uint uVar4;
  hugeint_t hVar5;
  hugeint_t input_00;
  string error;
  hugeint_t max_width;
  hugeint_t local_a8;
  undefined1 local_98 [16];
  char local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  hugeint_t local_58;
  string local_48;
  
  uVar3 = CONCAT31(in_register_00000089,width);
  local_a8.upper = input.lower;
  result_00 = (int32_t *)((((ulong)parameters & 0xffffffff) - (ulong)uVar3) * 0x10);
  local_58.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + (long)result_00);
  local_58.upper = *(int64_t *)(result_00 + 0x94c896);
  uVar4 = uVar3;
  local_a8.lower = (uint64_t)this;
  bVar2 = hugeint_t::operator>=(&local_a8,&local_58);
  params_2 = (uchar)uVar4;
  if (!bVar2) {
    local_98 = (undefined1  [16])hugeint_t::operator-(&local_58);
    bVar2 = hugeint_t::operator<=(&local_a8,(hugeint_t *)local_98);
    if (!bVar2) {
      hVar5 = hugeint_t::operator*(&local_a8,(hugeint_t *)(Hugeint::POWERS_OF_TEN + (uVar3 << 4)));
      auVar1._12_4_ = 0;
      auVar1._0_12_ = local_98._4_12_;
      local_98 = auVar1 << 0x20;
      input_00.upper = (int64_t)local_98;
      input_00.lower = hVar5.upper;
      Hugeint::TryCast<int>((Hugeint *)hVar5.lower,input_00,result_00);
      *(undefined4 *)input.upper = local_98._0_4_;
      return true;
    }
  }
  local_78[0] = local_68;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Could not cast value %s to DECIMAL(%d,%d)","");
  hugeint_t::ToString_abi_cxx11_(&local_48,&local_a8);
  StringUtil::Format<std::__cxx11::string,unsigned_char,unsigned_char>
            ((string *)local_98,(StringUtil *)local_78,&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)parameters & 0xff),width,params_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  HandleCastError::AssignError((string *)local_98,(CastParameters *)result);
  if ((char *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_);
  }
  return false;
}

Assistant:

bool HugeintToDecimalCast(hugeint_t input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	hugeint_t max_width = Hugeint::POWERS_OF_TEN[width - scale];
	if (input >= max_width || input <= -max_width) {
		string error = StringUtil::Format("Could not cast value %s to DECIMAL(%d,%d)", input.ToString(), width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = Hugeint::Cast<DST>(input * Hugeint::POWERS_OF_TEN[scale]);
	return true;
}